

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void * __thiscall
CVmVarHeapHybrid::realloc_mem(CVmVarHeapHybrid *this,size_t siz,void *mem,CVmObject *obj)

{
  ulong *puVar1;
  code *UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  
  puVar1 = &this->objtab_->bytes_since_gc_;
  *puVar1 = *puVar1 + siz;
  UNRECOVERED_JUMPTABLE = *(code **)(**(long **)((long)mem + -8) + 0x20);
  pvVar2 = (void *)(*UNRECOVERED_JUMPTABLE)
                             (*(long **)((long)mem + -8),(long)mem + -8,siz,obj,
                              UNRECOVERED_JUMPTABLE);
  return pvVar2;
}

Assistant:

void *CVmVarHeapHybrid::realloc_mem(size_t siz, void *mem,
                                    CVmObject *obj)
{
    CVmVarHeapHybrid_hdr *hdr;

    /* 
     *   Count the allocation.  This isn't really a new allocation of 'siz'
     *   bytes, since we're only expanding an object that already has a
     *   non-zero size.  But in many cases this will simply allocate new
     *   memory anyway, copying the old object into the new memory, so it
     *   could actually count against our OS-level working set.  That makes
     *   it worthwhile to count it against the GC quota.  
     */
    objtab_->count_alloc(siz);

    /* 
     *   get the block header, which immediately precedes the
     *   caller-visible block 
     */
    hdr = ((CVmVarHeapHybrid_hdr *)mem) - 1;

    /* count the gc statistics if desired */
    IF_GC_STATS((gc_stats.count_realloc_bytes(hdr->siz, siz), hdr->siz = siz));

    /*
     *   read the header to get the block manager that originally
     *   allocated the memory, and ask it to reallocate the memory 
     */
    return hdr->block->realloc(hdr, siz, obj);
}